

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O2

int tbx_readrec(BGZF *fp,void *tbxv,void *sv,int *tid,int *beg,int *end)

{
  int iVar1;
  tbx_intv_t intv;
  
  iVar1 = bgzf_getline(fp,10,(kstring_t *)sv);
  if (-1 < iVar1) {
    get_intv((tbx_t *)tbxv,(kstring_t *)sv,&intv,0);
    *tid = intv.tid;
    *beg = (int)intv.beg;
    *end = (int)intv.end;
  }
  return iVar1;
}

Assistant:

int tbx_readrec(BGZF *fp, void *tbxv, void *sv, int *tid, int *beg, int *end)
{
    tbx_t *tbx = (tbx_t *) tbxv;
    kstring_t *s = (kstring_t *) sv;
    int ret;
    if ((ret = bgzf_getline(fp, '\n', s)) >= 0) {
        tbx_intv_t intv;
        get_intv(tbx, s, &intv, 0);
        *tid = intv.tid; *beg = intv.beg; *end = intv.end;
    }
    return ret;
}